

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O1

int16_list * get_int16_list(BinarySource *in)

{
  uintmax_t n;
  int16_list *piVar1;
  uintmax_t uVar2;
  uintmax_t uVar3;
  
  n = get_uint(in);
  piVar1 = make_int16_list(n);
  if (n != 0) {
    uVar3 = 0;
    do {
      uVar2 = get_uint(in);
      piVar1->integers[uVar3] = (uint16_t)uVar2;
      uVar3 = uVar3 + 1;
    } while (n != uVar3);
  }
  return piVar1;
}

Assistant:

static int16_list *get_int16_list(BinarySource *in)
{
    size_t n = get_uint(in);
    int16_list *list = make_int16_list(n);
    for (size_t i = 0; i < n; i++)
        list->integers[i] = get_uint(in);
    return list;
}